

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cc
# Opt level: O2

rune re2c::utf8::max_rune(uint32_t i)

{
  rune rVar1;
  
  rVar1 = 0xfffd;
  if (i - 1 < 4) {
    rVar1 = *(rune *)(&DAT_00151310 + (ulong)(i - 1) * 4);
  }
  return rVar1;
}

Assistant:

utf8::rune utf8::max_rune(uint32_t i)
{
	switch (i)
	{
		case 1:  return MAX_1BYTE_RUNE;
		case 2:  return MAX_2BYTE_RUNE;
		case 3:  return MAX_3BYTE_RUNE;
		case 4:  return MAX_4BYTE_RUNE;
		default: return ERROR;
	}
}